

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

GeometryShaderExecutor *
deqp::gls::ShaderExecUtil::GeometryShaderExecutor::create
          (RenderContext *renderCtx,ShaderSpec *shaderSpec)

{
  bool bVar1;
  GeometryShaderExecutor *this;
  string local_38;
  
  bVar1 = glu::glslVersionIsES(shaderSpec->version);
  if ((bVar1) && ((int)shaderSpec->version < 3)) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"GL_EXT_geometry_shader","")
    ;
    checkExtension(renderCtx,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  this = (GeometryShaderExecutor *)operator_new(0x158);
  GeometryShaderExecutor(this,renderCtx,shaderSpec);
  return this;
}

Assistant:

GeometryShaderExecutor* GeometryShaderExecutor::create (const glu::RenderContext& renderCtx, const ShaderSpec& shaderSpec)
{
	if (glu::glslVersionIsES(shaderSpec.version) && shaderSpec.version <= glu::GLSL_VERSION_310_ES)
		checkExtension(renderCtx, "GL_EXT_geometry_shader");

	return new GeometryShaderExecutor(renderCtx, shaderSpec);
}